

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  size_t sVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  int iVar8;
  
  pIVar2 = GImGui;
  if (type == (char *)0x0) {
    __assert_fail("type != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2e13,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  sVar3 = strlen(type);
  if (0x20 < sVar3) {
    __assert_fail("strlen(type) < ((int)(sizeof(payload.DataType) / sizeof(*(payload.DataType)))) && \"Payload type can be at most 32 characters long\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2e14,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((data == (void *)0x0 || data_size == 0) && ((data != (void *)0x0 || (data_size != 0)))) {
    __assert_fail("(data != __null && data_size > 0) || (data == __null && data_size == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2e15,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if (2 < (uint)cond) {
    __assert_fail("cond == ImGuiCond_Always || cond == ImGuiCond_Once",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2e16,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((pIVar2->DragDropPayload).SourceId == 0) {
    __assert_fail("payload.SourceId != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2e17,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((1 < (uint)cond) && ((pIVar2->DragDropPayload).DataFrameCount != -1)) goto LAB_00169811;
  strncpy((pIVar2->DragDropPayload).DataType,type,0x20);
  (pIVar2->DragDropPayload).DataType[0x20] = '\0';
  iVar5 = (pIVar2->DragDropPayloadBufHeap).Capacity;
  if (iVar5 < 0) {
    iVar5 = iVar5 / 2 + iVar5;
    iVar8 = 0;
    if (0 < iVar5) {
      iVar8 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    puVar4 = (uchar *)(*GImAllocatorAllocFunc)((size_t)iVar8,GImAllocatorUserData);
    puVar7 = (pIVar2->DragDropPayloadBufHeap).Data;
    if (puVar7 != (uchar *)0x0) {
      memcpy(puVar4,puVar7,(long)(pIVar2->DragDropPayloadBufHeap).Size);
      puVar7 = (pIVar2->DragDropPayloadBufHeap).Data;
      if ((puVar7 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
    }
    (pIVar2->DragDropPayloadBufHeap).Data = puVar4;
    (pIVar2->DragDropPayloadBufHeap).Capacity = iVar8;
  }
  (pIVar2->DragDropPayloadBufHeap).Size = 0;
  iVar5 = (int)data_size;
  if (data_size < 0x11) {
    if (data_size != 0) {
      puVar7 = pIVar2->DragDropPayloadBufLocal;
      pIVar2->DragDropPayloadBufLocal[0] = '\0';
      pIVar2->DragDropPayloadBufLocal[1] = '\0';
      pIVar2->DragDropPayloadBufLocal[2] = '\0';
      pIVar2->DragDropPayloadBufLocal[3] = '\0';
      pIVar2->DragDropPayloadBufLocal[4] = '\0';
      pIVar2->DragDropPayloadBufLocal[5] = '\0';
      pIVar2->DragDropPayloadBufLocal[6] = '\0';
      pIVar2->DragDropPayloadBufLocal[7] = '\0';
      pIVar2->DragDropPayloadBufLocal[8] = '\0';
      pIVar2->DragDropPayloadBufLocal[9] = '\0';
      pIVar2->DragDropPayloadBufLocal[10] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xb] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xc] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xd] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xe] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xf] = '\0';
      goto LAB_001697f8;
    }
    (pIVar2->DragDropPayload).Data = (void *)0x0;
  }
  else {
    iVar8 = (pIVar2->DragDropPayloadBufHeap).Capacity;
    if (iVar8 < iVar5) {
      if (iVar8 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar8 / 2 + iVar8;
      }
      if (iVar6 <= iVar5) {
        iVar6 = iVar5;
      }
      if (iVar8 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        puVar4 = (uchar *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
        puVar7 = (pIVar2->DragDropPayloadBufHeap).Data;
        if (puVar7 != (uchar *)0x0) {
          memcpy(puVar4,puVar7,(long)(pIVar2->DragDropPayloadBufHeap).Size);
          puVar7 = (pIVar2->DragDropPayloadBufHeap).Data;
          if ((puVar7 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
        }
        (pIVar2->DragDropPayloadBufHeap).Data = puVar4;
        (pIVar2->DragDropPayloadBufHeap).Capacity = iVar6;
      }
    }
    (pIVar2->DragDropPayloadBufHeap).Size = iVar5;
    puVar7 = (pIVar2->DragDropPayloadBufHeap).Data;
LAB_001697f8:
    (pIVar2->DragDropPayload).Data = puVar7;
    memcpy(puVar7,data,data_size);
  }
  (pIVar2->DragDropPayload).DataSize = iVar5;
LAB_00169811:
  iVar5 = pIVar2->FrameCount;
  (pIVar2->DragDropPayload).DataFrameCount = iVar5;
  return pIVar2->DragDropAcceptFrameCount == iVar5 + -1 || pIVar2->DragDropAcceptFrameCount == iVar5
  ;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    // Return whether the payload has been accepted
    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}